

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<const_kj::File> __thiscall
kj::anon_unknown_8::DiskDirectory::createTemporary(DiskDirectory *this)

{
  PathPtr finalName;
  size_t sVar1;
  Iface *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  AutoCloseFd AVar6;
  Clock *clock;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  File *extraout_RDX_03;
  File *pFVar7;
  File *extraout_RDX_04;
  long in_RSI;
  AutoCloseFd __name;
  DiskHandle *this_00;
  File *ptrCopy;
  StringPtr name;
  Own<kj::File> OVar8;
  Own<const_kj::File> OVar9;
  int newFd_;
  AutoCloseFd newFd;
  AutoCloseFd newFd_1;
  Fault f;
  Fault f_1;
  int local_bc;
  AutoCloseFd local_b8;
  AutoCloseFd local_b0;
  AutoCloseFd local_a8;
  AutoCloseFd AStack_a0;
  size_t local_98;
  ArrayDisposer *pAStack_90;
  undefined1 local_88 [4];
  UnwindDetector UStack_84;
  size_t sStack_80;
  ArrayDisposer *local_78;
  Function<int_(kj::StringPtr)> local_68;
  Maybe<kj::String> local_58;
  Fault local_38;
  
  this_00 = (DiskHandle *)(in_RSI + 8);
  do {
    lVar5 = syscall(0x101,(ulong)(uint)(this_00->fd).fd,".",0x410002,0x1c0);
    local_bc = (int)lVar5;
    if (-1 < local_bc) {
      iVar3 = 0;
      pFVar7 = extraout_RDX;
      break;
    }
    iVar3 = _::Debug::getOsErrorNumber(false);
    pFVar7 = extraout_RDX_00;
  } while (iVar3 == -1);
  if (iVar3 == 0) {
    local_a8.fd = local_bc;
    UnwindDetector::UnwindDetector(&local_a8.unwindDetector);
    local_b0.fd = local_a8.fd;
    UnwindDetector::UnwindDetector(&local_b0.unwindDetector);
    local_a8.fd = -1;
    AVar6 = (AutoCloseFd)operator_new(0x10);
    *(undefined ***)AVar6 = &PTR_getFd_00289858;
    *(int *)((long)AVar6 + 8) = local_b0.fd;
    UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar6 + 0xc));
    local_b0.fd = -1;
    *(undefined ***)AVar6 = &PTR_getFd_0028a398;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
    (this->super_DiskHandle).fd = AVar6;
    AutoCloseFd::~AutoCloseFd(&local_b0);
    AutoCloseFd::~AutoCloseFd(&local_a8);
    pFVar7 = extraout_RDX_02;
  }
  else if ((1 < iVar3 - 0x15U) && (iVar3 != 0x5f)) {
    local_58.ptr._0_8_ = (_func_int **)0x0;
    local_a8.fd = 0;
    local_a8.unwindDetector.uncaughtCount = 0;
    AStack_a0.fd = 0;
    AStack_a0.unwindDetector.uncaughtCount = 0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::~Fault((Fault *)&local_58);
    pFVar7 = extraout_RDX_01;
  }
  if (iVar3 != 0) {
    name.content.size_ = 8;
    name.content.ptr = "unnamed";
    Path::Path((Path *)local_88,name);
    finalName.parts.ptr._4_4_ = UStack_84.uncaughtCount;
    finalName.parts.ptr._0_4_ = local_88;
    finalName.parts.size_ = sStack_80;
    local_68.impl.ptr = (Iface *)operator_new(0x18);
    (local_68.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a898;
    local_68.impl.ptr[1]._vptr_Iface = (_func_int **)&local_bc;
    local_68.impl.ptr[2]._vptr_Iface = (_func_int **)this_00;
    local_68.impl.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::createTemporary()const::{lambda(kj::StringPtr)#1}>>
          ::instance;
    DiskHandle::createNamedTemporary(&local_58,this_00,finalName,CREATE,&local_68);
    pIVar2 = local_68.impl.ptr;
    local_a8.fd._0_1_ = local_58.ptr.isSet;
    if ((kj)local_58.ptr.isSet == (kj)0x1) {
      AStack_a0 = (AutoCloseFd)local_58.ptr.field_1.value.content.ptr;
      local_98 = local_58.ptr.field_1.value.content.size_;
      pAStack_90 = local_58.ptr.field_1.value.content.disposer;
      local_58.ptr.field_1.value.content.ptr = (char *)0x0;
      local_58.ptr.field_1.value.content.size_ = 0;
    }
    if (local_68.impl.ptr != (Iface *)0x0) {
      local_68.impl.ptr = (Iface *)0x0;
      (**(local_68.impl.disposer)->_vptr_Disposer)
                (local_68.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
    }
    sVar1 = sStack_80;
    lVar5 = CONCAT44(UStack_84.uncaughtCount,local_88);
    if (lVar5 != 0) {
      local_88 = (undefined1  [4])0x0;
      UStack_84.uncaughtCount = 0;
      sStack_80 = 0;
      (**local_78->_vptr_ArrayDisposer)
                (local_78,lVar5,0x18,sVar1,sVar1,
                 ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
    if ((char)local_a8.fd == '\x01') {
      local_88 = (undefined1  [4])local_bc;
      UnwindDetector::UnwindDetector(&UStack_84);
      local_b8.fd = (int)local_88;
      UnwindDetector::UnwindDetector(&local_b8.unwindDetector);
      local_88 = (undefined1  [4])0xffffffff;
      AVar6 = (AutoCloseFd)operator_new(0x10);
      *(undefined ***)AVar6 = &PTR_getFd_00289858;
      *(int *)((long)AVar6 + 8) = local_b8.fd;
      UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar6 + 0xc));
      local_b8.fd = -1;
      *(undefined ***)AVar6 = &PTR_getFd_0028a398;
      AutoCloseFd::~AutoCloseFd(&local_b8);
      do {
        __name = (AutoCloseFd)((long)"();\n\n" + 5);
        if (local_98 != 0) {
          __name = AStack_a0;
        }
        iVar4 = 0;
        iVar3 = unlinkat((this_00->fd).fd,(char *)__name,0);
      } while ((iVar3 < 0) && (iVar4 = _::Debug::getOsErrorNumber(false), iVar4 == -1));
      if (iVar4 != 0) {
        local_38.exception = (Exception *)0x0;
        local_58.ptr._0_8_ = (_func_int **)0x0;
        local_58.ptr.field_1.value.content.ptr = (char *)0x0;
        _::Debug::Fault::init
                  (&local_38,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::~Fault(&local_38);
      }
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
      (this->super_DiskHandle).fd = AVar6;
      AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_88);
      pFVar7 = extraout_RDX_03;
    }
    else {
      clock = nullClock();
      OVar8 = newInMemoryFile((kj *)&local_58,clock);
      pFVar7 = OVar8.ptr;
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)local_58.ptr._0_8_;
      (this->super_DiskHandle).fd = (AutoCloseFd)local_58.ptr.field_1.value.content.ptr;
    }
    sVar1 = local_98;
    AVar6 = AStack_a0;
    if (((char)local_a8.fd == '\x01') && (AStack_a0 != (AutoCloseFd)0x0)) {
      AStack_a0.fd = 0;
      AStack_a0.unwindDetector.uncaughtCount = 0;
      local_98 = 0;
      (**pAStack_90->_vptr_ArrayDisposer)(pAStack_90,AVar6,1,sVar1,sVar1,0);
      pFVar7 = extraout_RDX_04;
    }
  }
  OVar9.ptr = pFVar7;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }